

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

isobusfs_error linux_error_to_isobusfs_error(int linux_err)

{
  switch(linux_err) {
  case 0:
    break;
  case -0x26:
    linux_err = ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
    break;
  case -0x24:
    linux_err = ISOBUSFS_ERR_INVALID_SRC_NAME;
    break;
  case -0x1e:
    linux_err = ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
    break;
  case -0x1d:
    linux_err = ISOBUSFS_ERR_END_OF_FILE;
    break;
  case -0x1c:
    linux_err = ISOBUSFS_ERR_NO_SPACE;
    break;
  case -0x18:
    linux_err = ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
    break;
  case -0x16:
    linux_err = ISOBUSFS_ERR_INVALID_DST_NAME;
    break;
  case -0x14:
    linux_err = ISOBUSFS_ERR_INVALID_ACCESS;
    break;
  case -0x13:
    linux_err = ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
    break;
  case -0xe:
    linux_err = ISOBUSFS_ERR_ON_READ;
    break;
  case -0xd:
    linux_err = ISOBUSFS_ERR_ACCESS_DENIED;
    break;
  case -0xc:
    linux_err = ISOBUSFS_ERR_OUT_OF_MEM;
    break;
  case -9:
    linux_err = ISOBUSFS_ERR_INVALID_HANDLE;
    break;
  case -5:
    linux_err = ISOBUSFS_ERR_ON_WRITE;
    break;
  case -2:
    linux_err = ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
    break;
  default:
    if (linux_err == -0x5a) {
      return ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
    }
    if (linux_err == -0x54) {
      return ISOBUSFS_ERR_MALFORMED_REQUEST;
    }
    if (linux_err == -0x47) {
      return ISOBUSFS_ERR_TAN_ERR;
    }
  case -0x25:
  case -0x23:
  case -0x22:
  case -0x21:
  case -0x20:
  case -0x1f:
  case -0x1b:
  case -0x1a:
  case -0x19:
  case -0x17:
  case -0x15:
  case -0x12:
  case -0x11:
  case -0x10:
  case -0xf:
  case -0xb:
  case -10:
  case -8:
  case -7:
  case -6:
  case -4:
  case -3:
  case -1:
    linux_err = ISOBUSFS_ERR_OTHER;
  }
  return linux_err;
}

Assistant:

enum isobusfs_error linux_error_to_isobusfs_error(int linux_err)
{
	switch (linux_err) {
	case 0:
		return ISOBUSFS_ERR_SUCCESS;
	case -EINVAL:
		return ISOBUSFS_ERR_INVALID_DST_NAME;
	case -EACCES:
		return ISOBUSFS_ERR_ACCESS_DENIED;
	case -ENOTDIR:
		return ISOBUSFS_ERR_INVALID_ACCESS;
	case -EMFILE:
		return ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
	case -ENOENT:
		return ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
	case -EBADF:
		return ISOBUSFS_ERR_INVALID_HANDLE;
	case -ENAMETOOLONG:
		return ISOBUSFS_ERR_INVALID_SRC_NAME;
	case -ENOSPC:
		return ISOBUSFS_ERR_NO_SPACE;
	case -EIO:
		return ISOBUSFS_ERR_ON_WRITE;
	case -ENODEV:
		return ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
	case -EROFS:
		return ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
	case -EFAULT:
		return ISOBUSFS_ERR_ON_READ;
	case -ENOSYS:
		return ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
	case -EMSGSIZE:
		return ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
	case -ENOMEM:
		return ISOBUSFS_ERR_OUT_OF_MEM;
	case -EPERM:
		return ISOBUSFS_ERR_OTHER;
	case -ESPIPE:
		return ISOBUSFS_ERR_END_OF_FILE;
	case -EPROTO:
		return ISOBUSFS_ERR_TAN_ERR;
	case -EILSEQ:
		return ISOBUSFS_ERR_MALFORMED_REQUEST;
	default:
		return ISOBUSFS_ERR_OTHER;
	}
}